

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QPodArrayOps<int>::insert
          (QPodArrayOps<int> *this,qsizetype i,qsizetype n,parameter_type t)

{
  int *piVar1;
  int in_ECX;
  long in_RDX;
  QArrayDataPointer<int> *in_RSI;
  long in_RDI;
  int *where;
  GrowthPosition pos;
  int copy;
  QArrayDataPointer<int> *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 uVar2;
  int iVar3;
  
  uVar2 = 0;
  if ((*(long *)(in_RDI + 0x10) != 0) && (in_RSI == (QArrayDataPointer<int> *)0x0)) {
    uVar2 = 1;
  }
  iVar3 = in_ECX;
  QArrayDataPointer<int>::detachAndGrow
            (in_RSI,(GrowthPosition)((ulong)in_RDX >> 0x20),CONCAT44(in_ECX,in_ECX),
             (int **)CONCAT44(uVar2,in_stack_ffffffffffffffd8),in_stack_ffffffffffffffd0);
  piVar1 = createHole((QPodArrayOps<int> *)in_RSI,(GrowthPosition)((ulong)in_RDX >> 0x20),
                      CONCAT44(iVar3,in_ECX),CONCAT44(uVar2,in_stack_ffffffffffffffd8));
  while (in_RDX != 0) {
    *piVar1 = in_ECX;
    piVar1 = piVar1 + 1;
    in_RDX = in_RDX + -1;
  }
  return;
}

Assistant:

void insert(qsizetype i, qsizetype n, parameter_type t)
    {
        T copy(t);

        typename Data::GrowthPosition pos = Data::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = Data::GrowsAtBeginning;

        this->detachAndGrow(pos, n, nullptr, nullptr);
        Q_ASSERT((pos == Data::GrowsAtBeginning && this->freeSpaceAtBegin() >= n) ||
                 (pos == Data::GrowsAtEnd && this->freeSpaceAtEnd() >= n));

        T *where = createHole(pos, i, n);
        while (n--)
            *where++ = copy;
    }